

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::shlSlowCase(APInt *this,uint ShiftAmt)

{
  tcShiftLeft((this->U).pVal,(uint)((ulong)this->BitWidth + 0x3f >> 6),ShiftAmt);
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::shlSlowCase(unsigned ShiftAmt) {
  tcShiftLeft(U.pVal, getNumWords(), ShiftAmt);
  clearUnusedBits();
}